

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  undefined1 n [16];
  format_specs specs;
  string_view prefix;
  num_writer f;
  char cVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  undefined8 uVar11;
  reference pcVar12;
  undefined8 uVar13;
  char *pcVar14;
  long *in_RDI;
  string_view sVar15;
  const_iterator group;
  int size;
  int num_digits;
  char sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  locale_ref in_stack_fffffffffffffed0;
  locale_ref in_stack_fffffffffffffed8;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffff60;
  undefined6 uVar16;
  undefined4 in_stack_ffffffffffffff90;
  long lVar17;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 uVar18;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4 [12];
  string local_28 [40];
  
  grouping<char>(in_stack_fffffffffffffed8);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    uVar18 = *(undefined8 *)(*in_RDI + 8);
    cVar2 = thousands_sep<char>(in_stack_fffffffffffffed0);
    if (cVar2 == '\0') {
      on_dec(in_stack_ffffffffffffff60);
    }
    else {
      lVar17 = in_RDI[3];
      n._8_8_ = in_stack_fffffffffffffed8.locale_;
      n._0_8_ = in_stack_fffffffffffffed0.locale_;
      iVar6 = count_digits((uint128_t)n);
      iVar7 = iVar6;
      _Var10._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar11 = std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffed0.locale_,in_stack_fffffffffffffec8);
        bVar5 = false;
        if (bVar3) {
          iVar8 = iVar7;
          pcVar12 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffff88);
          bVar5 = false;
          bVar3 = *pcVar12 < iVar7;
          iVar7 = iVar8;
          if (bVar3) {
            pcVar12 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffff88);
            bVar5 = false;
            iVar7 = iVar8;
            if ('\0' < *pcVar12) {
              pcVar12 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffff88);
              cVar1 = *pcVar12;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
              iVar7 = iVar8;
            }
          }
        }
        if (!bVar5) break;
        iVar6 = iVar6 + 1;
        pcVar12 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffff88);
        iVar7 = iVar7 - *pcVar12;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff88);
      }
      uVar13 = std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffed0.locale_,in_stack_fffffffffffffec8);
      if (bVar5) {
        iVar8 = iVar7 + -1;
        pcVar14 = (char *)std::__cxx11::string::back();
        iVar6 = iVar8 / (int)*pcVar14 + iVar6;
      }
      sVar15 = get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)
                          0x1470c4);
      prefix.size_._0_4_ = in_stack_ffffffffffffff90;
      prefix.data_ = _Var10._M_current;
      prefix.size_._4_4_ = iVar6;
      uVar16 = (undefined6)((ulong)uVar11 >> 0x10);
      specs.type = (char)uVar11;
      specs._9_1_ = (char)((ulong)uVar11 >> 8);
      specs.fill.data_[0] = (char)uVar16;
      specs.fill.data_[1] = (char)((uint6)uVar16 >> 8);
      specs.fill.data_[2] = (char)((uint6)uVar16 >> 0x10);
      specs.fill.data_[3] = (char)((uint6)uVar16 >> 0x18);
      specs.fill.data_[4] = (char)((uint6)uVar16 >> 0x20);
      specs.fill.data_[5] = (char)((uint6)uVar16 >> 0x28);
      specs.width = (int)uVar13;
      specs.precision = (int)((ulong)uVar13 >> 0x20);
      f.abs_value._8_4_ = in_stack_ffffffffffffffa8;
      f.abs_value._0_8_ = lVar17;
      f.abs_value._12_4_ = iVar7;
      f._16_8_ = uVar18;
      f.groups._0_7_ = in_stack_ffffffffffffffb8;
      f.groups._7_1_ = cVar2;
      f._32_4_ = in_stack_ffffffffffffffc0;
      f._36_12_ = in_stack_ffffffffffffffc4;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>_> *)sVar15.size_,sVar15.data_._4_4_,
                 prefix,specs,f);
    }
  }
  else {
    on_dec(in_stack_ffffffffffffff60);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }